

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

bool __thiscall pbrt::MixMaterial::IsTransparent(MixMaterial *this)

{
  ulong uVar1;
  bool bVar2;
  
  while( true ) {
    uVar1 = this->materials[0].
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits;
    if (0x9ffffffffffff < uVar1) {
      if ((uVar1 & 0xffff000000000000) == 0xa000000000000) {
        return true;
      }
      bVar2 = IsTransparent((MixMaterial *)(uVar1 & 0xffffffffffff));
      if (bVar2) {
        return true;
      }
    }
    uVar1 = this->materials[1].
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits;
    if (uVar1 < 0xa000000000000) {
      return false;
    }
    if ((uVar1 & 0xffff000000000000) == 0xa000000000000) break;
    this = (MixMaterial *)(uVar1 & 0xffffffffffff);
  }
  return true;
}

Assistant:

PBRT_CPU_GPU
    bool IsTransparent() const {
#ifdef PBRT_IS_GPU_CODE
        return false;
#else
        return materials[0].IsTransparent() || materials[1].IsTransparent();
#endif
    }